

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest_ErrorsReportedToLogError_Test::TestBody
          (ValidationErrorTest_ErrorsReportedToLogError_Test *this)

{
  FileDescriptor *pFVar1;
  Message *in_RCX;
  char *in_R9;
  pointer *__ptr;
  string_view input;
  ScopedMockLog log;
  FileDescriptorProto file_proto;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_2a0;
  undefined1 local_288 [8];
  VTable *local_280;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_270;
  undefined1 local_258 [8];
  undefined1 local_250 [24];
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_238;
  MatcherBase<absl::lts_20250127::LogSeverity> local_220;
  undefined1 local_208 [240];
  FileDescriptorProto local_118;
  
  FileDescriptorProto::FileDescriptorProto(&local_118,(Arena *)0x0);
  input._M_str = (char *)&local_118;
  input._M_len = (size_t)
                 "name: \"foo.proto\" message_type { name: \"Foo\" } message_type { name: \"Foo\" } "
  ;
  local_258[0] = (internal)TextFormat::ParseFromString((TextFormat *)0x4c,input,in_RCX);
  local_250._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((bool)local_258[0]) {
    absl::lts_20250127::ScopedMockLog::ScopedMockLog((ScopedMockLog *)local_208,kDisallowUnexpected)
    ;
    testing::Matcher<absl::lts_20250127::LogSeverity>::Matcher
              ((Matcher<absl::lts_20250127::LogSeverity> *)local_288,kError);
    local_2a0.buffer_.ptr = (void *)0x0;
    local_2a0.vtable_ =
         (VTable *)
         testing::internal::MatcherBase<std::__cxx11::string_const&>::
         GetVTable<testing::internal::MatcherBase<std::__cxx11::string_const&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
         ::kVTable_abi_cxx11_;
    local_2a0.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
         (_func_int **)&PTR__MatcherBase_0186ff48;
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
               *)&local_270,"Invalid proto descriptor for file \"foo.proto\":");
    absl::lts_20250127::ScopedMockLog::gmock_Log
              ((MockSpec<void_(absl::lts_20250127::LogSeverity,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)local_258,(ScopedMockLog *)local_208,
               (Matcher<absl::lts_20250127::LogSeverity> *)local_288,
               (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_2a0,
               (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_270);
    testing::internal::GetWithoutMatchers();
    testing::internal::
    MockSpec<void_(absl::lts_20250127::LogSeverity,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::InternalExpectedAt
              ((MockSpec<void_(absl::lts_20250127::LogSeverity,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)local_258,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x1b4b,"log",
               "Log(absl::LogSeverity::kError, testing::_, \"Invalid proto descriptor for file \\\"foo.proto\\\":\")"
              );
    testing::internal::MatcherBase<absl::lts_20250127::LogSeverity>::~MatcherBase(&local_220);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_238);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase((MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                    *)local_250);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_270);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_2a0);
    testing::internal::MatcherBase<absl::lts_20250127::LogSeverity>::~MatcherBase
              ((MatcherBase<absl::lts_20250127::LogSeverity> *)local_288);
    testing::Matcher<absl::lts_20250127::LogSeverity>::Matcher
              ((Matcher<absl::lts_20250127::LogSeverity> *)local_288,kError);
    local_2a0.buffer_.ptr = (void *)0x0;
    local_2a0.vtable_ =
         (VTable *)
         testing::internal::MatcherBase<std::__cxx11::string_const&>::
         GetVTable<testing::internal::MatcherBase<std::__cxx11::string_const&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
         ::kVTable_abi_cxx11_;
    local_2a0.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
         (_func_int **)&PTR__MatcherBase_0186ff48;
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
               *)&local_270,"  Foo: \"Foo\" is already defined.");
    absl::lts_20250127::ScopedMockLog::gmock_Log
              ((MockSpec<void_(absl::lts_20250127::LogSeverity,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)local_258,(ScopedMockLog *)local_208,
               (Matcher<absl::lts_20250127::LogSeverity> *)local_288,
               (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_2a0,
               (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_270);
    testing::internal::GetWithoutMatchers();
    testing::internal::
    MockSpec<void_(absl::lts_20250127::LogSeverity,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::InternalExpectedAt
              ((MockSpec<void_(absl::lts_20250127::LogSeverity,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)local_258,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x1b4d,"log",
               "Log(absl::LogSeverity::kError, testing::_, \"  Foo: \\\"Foo\\\" is already defined.\")"
              );
    testing::internal::MatcherBase<absl::lts_20250127::LogSeverity>::~MatcherBase(&local_220);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_238);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase((MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                    *)local_250);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_270);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_2a0);
    testing::internal::MatcherBase<absl::lts_20250127::LogSeverity>::~MatcherBase
              ((MatcherBase<absl::lts_20250127::LogSeverity> *)local_288);
    absl::lts_20250127::ScopedMockLog::StartCapturingLogs((ScopedMockLog *)local_208);
    pFVar1 = DescriptorPool::BuildFile(&(this->super_ValidationErrorTest).pool_,&local_118);
    local_288[0] = (internal)(pFVar1 == (FileDescriptor *)0x0);
    local_280 = (VTable *)0x0;
    if (!(bool)local_288[0]) {
      testing::Message::Message((Message *)&local_2a0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_258,(internal *)local_288,
                 (AssertionResult *)"pool_.BuildFile(file_proto) == nullptr","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_270,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0x1b4f,(char *)CONCAT71(local_258._1_7_,local_258[0]));
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_270,(Message *)&local_2a0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_270);
      if ((undefined1 *)CONCAT71(local_258._1_7_,local_258[0]) != local_250 + 8) {
        operator_delete((undefined1 *)CONCAT71(local_258._1_7_,local_258[0]),
                        (ulong)(local_250._8_8_ + 1));
      }
      if (local_2a0.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface !=
          (_func_int **)0x0) {
        (**(code **)(*local_2a0.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface + 8)
        )();
      }
      if (local_280 != (VTable *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_280,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280)
        ;
      }
    }
    absl::lts_20250127::ScopedMockLog::~ScopedMockLog((ScopedMockLog *)local_208);
  }
  else {
    testing::Message::Message((Message *)local_288);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_208,(internal *)local_258,
               (AssertionResult *)
               "TextFormat::ParseFromString(\"name: \\\"foo.proto\\\" \" \"message_type { name: \\\"Foo\\\" } \" \"message_type { name: \\\"Foo\\\" } \", &file_proto)"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2a0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x1b47,(char *)local_208._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2a0,(Message *)local_288);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2a0);
    if ((undefined1 *)local_208._0_8_ != local_208 + 0x10) {
      operator_delete((void *)local_208._0_8_,(ulong)(local_208._16_8_ + 1));
    }
    if ((long *)CONCAT71(local_288._1_7_,local_288[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_288._1_7_,local_288[0]) + 8))();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_250._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_250,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_250._0_8_);
    }
  }
  FileDescriptorProto::~FileDescriptorProto(&local_118);
  return;
}

Assistant:

TEST_F(ValidationErrorTest, ErrorsReportedToLogError) {
  // Test that errors are reported to ABSL_LOG(ERROR) if no error collector is
  // provided.

  FileDescriptorProto file_proto;
  ASSERT_TRUE(
      TextFormat::ParseFromString("name: \"foo.proto\" "
                                  "message_type { name: \"Foo\" } "
                                  "message_type { name: \"Foo\" } ",
                                  &file_proto));
  {
    absl::ScopedMockLog log(absl::MockLogDefault::kDisallowUnexpected);
    EXPECT_CALL(log, Log(absl::LogSeverity::kError, testing::_,
                         "Invalid proto descriptor for file \"foo.proto\":"));
    EXPECT_CALL(log, Log(absl::LogSeverity::kError, testing::_,
                         "  Foo: \"Foo\" is already defined."));
    log.StartCapturingLogs();
    EXPECT_TRUE(pool_.BuildFile(file_proto) == nullptr);
  }
}